

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmerdb.cpp
# Opt level: O0

KmersSet * load_kmer_raw_file2(string *filename,size_t set_initial_size,bool with_scores)

{
  size_type expected_max_items_in_table;
  bool bVar1;
  dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
  *pdVar2;
  streamoff sVar3;
  undefined1 auVar4 [16];
  pair<google::dense_hashtable_const_iterator<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>,_bool>
  local_2d0;
  ulong local_2b0;
  ulong local_2a8;
  uint64_t i_1;
  ulong local_280;
  uint64_t i;
  double score;
  uint64_t kmer_uint;
  undefined8 local_260;
  ulong local_258;
  uint64_t kmers_in_file;
  ifstream kmer_file;
  key_type local_48;
  undefined1 local_3d;
  libc_allocator_with_realloc<unsigned_long> local_2b;
  key_equal local_2a;
  hasher local_29;
  dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
  *local_28;
  KmersSet *kmer_list_to_use;
  size_t sStack_18;
  bool with_scores_local;
  size_t set_initial_size_local;
  string *filename_local;
  
  kmer_list_to_use._7_1_ = with_scores;
  sStack_18 = set_initial_size;
  set_initial_size_local = (size_t)filename;
  pdVar2 = (dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
            *)operator_new(0x50);
  expected_max_items_in_table = sStack_18;
  local_3d = 1;
  google::libc_allocator_with_realloc<unsigned_long>::libc_allocator_with_realloc(&local_2b);
  google::
  dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
  ::dense_hash_set(pdVar2,expected_max_items_in_table,&local_29,&local_2a,&local_2b);
  local_3d = 0;
  google::libc_allocator_with_realloc<unsigned_long>::~libc_allocator_with_realloc(&local_2b);
  local_48 = 0xffffffffffffffff;
  local_28 = pdVar2;
  google::
  dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
  ::set_empty_key(pdVar2,&local_48);
  std::ifstream::ifstream(&kmers_in_file,(string *)filename,_S_bin);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&kmers_in_file + *(long *)(kmers_in_file - 0x18)));
  if (bVar1) {
    std::istream::seekg((long)&kmers_in_file,_S_beg);
    auVar4 = std::istream::tellg();
    local_260 = auVar4._8_8_;
    kmer_uint = auVar4._0_8_;
    sVar3 = std::fpos::operator_cast_to_long((fpos *)&kmer_uint);
    local_258 = sVar3 >> 3;
    if ((kmer_list_to_use._7_1_ & 1) != 0) {
      local_258 = local_258 >> 1;
    }
    std::istream::seekg((long)&kmers_in_file,_S_beg);
    if ((kmer_list_to_use._7_1_ & 1) == 0) {
      for (local_2a8 = 0; local_2a8 < local_258; local_2a8 = local_2a8 + 1) {
        std::istream::read((char *)&kmers_in_file,(long)&score);
        local_2b0 = (ulong)score & 0x3fffffffffffffff;
        google::
        dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
        ::insert(&local_2d0,local_28,&local_2b0);
      }
    }
    else {
      for (local_280 = 0; local_280 < local_258; local_280 = local_280 + 1) {
        std::istream::read((char *)&kmers_in_file,(long)&score);
        std::istream::read((char *)&kmers_in_file,(long)&i);
        google::
        dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>
        ::insert((pair<google::dense_hashtable_const_iterator<unsigned_long,_unsigned_long,_Hash64,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::Identity,_google::dense_hash_set<unsigned_long,_Hash64,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<unsigned_long>_>,_bool>
                  *)&i_1,local_28,(value_type *)&score);
      }
    }
    std::ifstream::close();
  }
  pdVar2 = local_28;
  std::ifstream::~ifstream(&kmers_in_file);
  return pdVar2;
}

Assistant:

KmersSet * load_kmer_raw_file2(string filename, size_t set_initial_size, const bool with_scores) {
	KmersSet *kmer_list_to_use = new KmersSet(set_initial_size);
	kmer_list_to_use->set_empty_key(NULL_KEY); // need to define empty value for google dense hash table

	ifstream kmer_file(filename, std::ifstream::binary);
	if(kmer_file) { // if file could be open
		kmer_file.seekg(0, kmer_file.end); // 
		uint64_t kmers_in_file = (kmer_file.tellg()) >> 3;
		if(with_scores) // Two words for each k-mer
			kmers_in_file = (kmers_in_file >> 1);
		kmer_file.seekg(0, kmer_file.beg);
		uint64_t kmer_uint;
		double score;
		if(with_scores) {
			for(uint64_t i=0; i<(kmers_in_file); i++) {
				kmer_file.read(reinterpret_cast<char *>(&kmer_uint), sizeof(kmer_uint));
				kmer_file.read(reinterpret_cast<char *>(&score), sizeof(score));
				kmer_list_to_use->insert(kmer_uint);
			}
		} else {
			for(uint64_t i=0; i<(kmers_in_file); i++) {
				kmer_file.read(reinterpret_cast<char *>(&kmer_uint), sizeof(kmer_uint));
				kmer_list_to_use->insert(kmer_uint&0x3FFFFFFFFFFFFFFF);
			}
		}
		kmer_file.close();
	}
	return kmer_list_to_use;
}